

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExtractor.h
# Opt level: O3

void __thiscall
hiberlite::ExtractModel::putColumn<hiberlite::AVisitor<hiberlite::ExtractModel>>
          (ExtractModel *this,AVisitor<hiberlite::ExtractModel> *av,string *storage)

{
  pointer pcVar1;
  Scope scope;
  string local_d8;
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  long local_90;
  undefined1 local_88 [16];
  int local_78;
  string local_70;
  string local_50;
  
  pcVar1 = (av->scope)._table._M_dataplus._M_p;
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar1,pcVar1 + (av->scope)._table._M_string_length);
  pcVar1 = (av->scope)._prefix._M_dataplus._M_p;
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + (av->scope)._prefix._M_string_length);
  local_78 = (av->scope).prefix_depth;
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_b8,local_b8 + local_b0);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_98,local_98 + local_90);
  pcVar1 = (storage->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + storage->_M_string_length);
  putNamedColumn(this,&local_d8,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
  }
  return;
}

Assistant:

inline void putColumn(AV& av, std::string storage)
		{
			Scope scope=av.getScope();
			putNamedColumn(scope.table(), scope.prefix(), storage);
		}